

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.cpp
# Opt level: O1

void __thiscall
cbtGImpactMeshShapePart::processAllTrianglesRay
          (cbtGImpactMeshShapePart *this,cbtTriangleCallback *callback,cbtVector3 *rayFrom,
          cbtVector3 *rayTo)

{
  uint uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  cbtVector3 cVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  bool bVar7;
  float fVar8;
  cbtVector3 rayDir;
  cbtAlignedObjectArray<int> collided;
  cbtPrimitiveTriangle triangle;
  cbtVector3 local_a8;
  cbtAlignedObjectArray<int> local_98;
  undefined1 local_78 [64];
  undefined4 local_38;
  
  (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0x1c])();
  local_98.m_ownsMemory = true;
  local_98.m_data = (int *)0x0;
  local_98.m_size = 0;
  local_98.m_capacity = 0;
  auVar3 = vinsertps_avx(ZEXT416((uint)(rayTo->m_floats[0] - rayFrom->m_floats[0])),
                         ZEXT416((uint)(rayTo->m_floats[1] - rayFrom->m_floats[1])),0x10);
  local_a8.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar3,ZEXT416((uint)(rayTo->m_floats[2] - rayFrom->m_floats[2])),0x28);
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(local_a8.m_floats[1] * local_a8.m_floats[1])),
                           ZEXT416((uint)local_a8.m_floats[0]),ZEXT416((uint)local_a8.m_floats[0]));
  auVar3 = vfmadd213ss_fma(ZEXT416((uint)local_a8.m_floats[2]),ZEXT416((uint)local_a8.m_floats[2]),
                           auVar3);
  if (auVar3._0_4_ < 0.0) {
    fVar8 = sqrtf(auVar3._0_4_);
  }
  else {
    auVar3 = vsqrtss_avx(auVar3,auVar3);
    fVar8 = auVar3._0_4_;
  }
  cVar4.m_floats = local_a8.m_floats;
  fVar8 = 1.0 / fVar8;
  local_a8.m_floats[1] = fVar8 * local_a8.m_floats[1];
  local_a8.m_floats[0] = fVar8 * local_a8.m_floats[0];
  local_a8.m_floats[2] = cVar4.m_floats[2];
  local_a8.m_floats[3] = cVar4.m_floats[3];
  local_a8.m_floats[2] = fVar8 * local_a8.m_floats[2];
  cbtGImpactQuantizedBvh::rayQuery
            (&(this->super_cbtGImpactShapeInterface).m_box_set,&local_a8,rayFrom,&local_98);
  lVar6 = (long)local_98.m_size;
  if (lVar6 == 0) {
    (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
      _vptr_cbtCollisionShape[0x1d])(this);
  }
  else {
    uVar1 = (this->m_primitive_manager).m_part;
    local_38 = 0x3c23d70a;
    while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
      iVar2 = local_98.m_data[lVar6];
      iVar5 = (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape
                ._vptr_cbtCollisionShape[0x15])(this);
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x28))
                ((long *)CONCAT44(extraout_var,iVar5),iVar2,local_78);
      (*callback->_vptr_cbtTriangleCallback[2])
                (callback,local_78,(ulong)uVar1,(ulong)(uint)local_98.m_data[lVar6]);
    }
    (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
      _vptr_cbtCollisionShape[0x1d])(this);
  }
  cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&local_98);
  return;
}

Assistant:

void cbtGImpactMeshShapePart::processAllTrianglesRay(cbtTriangleCallback* callback, const cbtVector3& rayFrom, const cbtVector3& rayTo) const
{
	lockChildShapes();

	cbtAlignedObjectArray<int> collided;
	cbtVector3 rayDir(rayTo - rayFrom);
	rayDir.normalize();
	m_box_set.rayQuery(rayDir, rayFrom, collided);

	if (collided.size() == 0)
	{
		unlockChildShapes();
		return;
	}

	int part = (int)getPart();
	cbtPrimitiveTriangle triangle;
	int i = collided.size();
	while (i--)
	{
		getPrimitiveTriangle(collided[i], triangle);
		callback->processTriangle(triangle.m_vertices, part, collided[i]);
	}
	unlockChildShapes();
}